

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.hpp
# Opt level: O1

bool __thiscall
OpenMD::SelectionCompiler::invalidExpressionToken(SelectionCompiler *this,string *ident)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"invalid expression token:",ident);
  bVar1 = compileError(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool invalidExpressionToken(const std::string& ident) {
      return compileError("invalid expression token:" + ident);
    }